

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

ssize_t sf_parse_integer_or_decimal(nghttp2_sf_value *dest,uint8_t *begin,uint8_t *end)

{
  char cVar1;
  long local_60;
  size_t i;
  size_t fpos;
  size_t len;
  long lStack_40;
  int type;
  int64_t value;
  byte *pbStack_30;
  int sign;
  uint8_t *p;
  uint8_t *end_local;
  uint8_t *begin_local;
  nghttp2_sf_value *dest_local;
  
  value._4_4_ = 1;
  lStack_40 = 0;
  cVar1 = '\x01';
  fpos = 0;
  i = 0;
  pbStack_30 = begin;
  if (*begin == '-') {
    pbStack_30 = begin + 1;
    if (pbStack_30 == end) {
      return -1;
    }
    value._4_4_ = -1;
  }
  if ((*pbStack_30 < 0x30) || (0x39 < *pbStack_30)) {
    dest_local = (nghttp2_sf_value *)0xffffffffffffffff;
  }
  else {
    for (; pbStack_30 != end; pbStack_30 = pbStack_30 + 1) {
      if (*pbStack_30 == 0x2e) {
        if (cVar1 != '\x01') break;
        if (0xc < fpos) {
          return -1;
        }
        i = fpos;
        cVar1 = '\x02';
      }
      else {
        if (9 < *pbStack_30 - 0x30) break;
        lStack_40 = (long)(int)(*pbStack_30 - 0x30) + lStack_40 * 10;
        fpos = fpos + 1;
        if (0xf < fpos) {
          return -1;
        }
      }
    }
    if (cVar1 == '\x01') {
      if (dest != (nghttp2_sf_value *)0x0) {
        dest->type = '\x01';
        (dest->field_1).i = lStack_40 * value._4_4_;
      }
      dest_local = (nghttp2_sf_value *)(pbStack_30 + -(long)begin);
    }
    else {
      if (cVar1 != '\x02') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_http.c"
                      ,0x2df,
                      "ssize_t sf_parse_integer_or_decimal(nghttp2_sf_value *, const uint8_t *, const uint8_t *)"
                     );
      }
      if ((i == fpos) || (3 < fpos - i)) {
        dest_local = (nghttp2_sf_value *)0xffffffffffffffff;
      }
      else {
        if (dest != (nghttp2_sf_value *)0x0) {
          dest->type = '\x02';
          (dest->field_1).d = (double)lStack_40;
          for (local_60 = fpos - i; local_60 != 0; local_60 = local_60 + -1) {
            (dest->field_1).d = (dest->field_1).d / 10.0;
          }
          (dest->field_1).d = (double)value._4_4_ * (dest->field_1).d;
        }
        dest_local = (nghttp2_sf_value *)(pbStack_30 + -(long)begin);
      }
    }
  }
  return (ssize_t)dest_local;
}

Assistant:

static ssize_t sf_parse_integer_or_decimal(nghttp2_sf_value *dest,
                                           const uint8_t *begin,
                                           const uint8_t *end) {
  const uint8_t *p = begin;
  int sign = 1;
  int64_t value = 0;
  int type = NGHTTP2_SF_VALUE_TYPE_INTEGER;
  size_t len = 0;
  size_t fpos = 0;
  size_t i;

  if (*p == '-') {
    if (++p == end) {
      return -1;
    }

    sign = -1;
  }

  if (*p < '0' || '9' < *p) {
    return -1;
  }

  for (; p != end; ++p) {
    switch (*p) {
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      value *= 10;
      value += *p - '0';

      if (++len > 15) {
        return -1;
      }

      break;
    case '.':
      if (type != NGHTTP2_SF_VALUE_TYPE_INTEGER) {
        goto fin;
      }

      if (len > 12) {
        return -1;
      }
      fpos = len;
      type = NGHTTP2_SF_VALUE_TYPE_DECIMAL;

      break;
    default:
      goto fin;
    };
  }

fin:
  switch (type) {
  case NGHTTP2_SF_VALUE_TYPE_INTEGER:
    if (dest) {
      dest->type = (uint8_t)type;
      dest->i = value * sign;
    }

    return p - begin;
  case NGHTTP2_SF_VALUE_TYPE_DECIMAL:
    if (fpos == len || len - fpos > 3) {
      return -1;
    }

    if (dest) {
      dest->type = (uint8_t)type;
      dest->d = (double)value;
      for (i = len - fpos; i > 0; --i) {
        dest->d /= (double)10;
      }
      dest->d *= sign;
    }

    return p - begin;
  default:
    assert(0);
    abort();
  }
}